

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall ProxyListener::ProxyListener(ProxyListener *this,string *host,uint port)

{
  pointer pcVar1;
  socklen_t in_ECX;
  
  (this->super_OscPacketListener).super_PacketListener._vptr_PacketListener =
       (_func_int **)&PTR__ProxyListener_0010c958;
  (this->proxy_).super___shared_ptr<UdpTransmitSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->proxy_).super___shared_ptr<UdpTransmitSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->host_)._M_dataplus._M_p = (pointer)&(this->host_).field_2;
  pcVar1 = (host->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->host_,pcVar1,pcVar1 + host->_M_string_length);
  this->port_ = port;
  memset(this->buffer_,0,0x400);
  this->buffer_[0] = '\0';
  if (host->_M_string_length != 0) {
    connect(this,(int)host,(sockaddr *)(ulong)port,in_ECX);
  }
  return;
}

Assistant:

ProxyListener(const std::string &host, unsigned port)
            : host_(host), port_(port) {
        buffer_[0] = 0;
        if (host.length() > 0) {
            connect(host, port);
        }
    }